

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cpp
# Opt level: O1

string * embree::getCPUVendor_abi_cxx11_(void)

{
  long lVar1;
  string *in_RDI;
  int name [4];
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  
  lVar1 = cpuid_basic_info(0);
  local_28 = *(undefined4 *)(lVar1 + 4);
  local_24 = *(undefined4 *)(lVar1 + 8);
  local_20 = *(undefined4 *)(lVar1 + 0xc);
  local_1c = 0;
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  strlen((char *)&local_28);
  std::__cxx11::string::_M_construct<char_const*>();
  return in_RDI;
}

Assistant:

std::string getCPUVendor()
  {
#if defined(__X86_ASM__)
    int cpuinfo[4]; 
    __cpuid (cpuinfo, 0); 
    int name[4];
    name[0] = cpuinfo[1];
    name[1] = cpuinfo[3];
    name[2] = cpuinfo[2];
    name[3] = 0;
    return (char*)name;
#elif defined(__ARM_NEON)
    return "ARM";
#else
    return "Unknown";
#endif
  }